

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O2

buffer_ptr_t __thiscall rudp::session::generate_rst(session *this)

{
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *this_00;
  reference puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer_ptr_t bVar2;
  
  this_00 = (vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
             *)operator_new(0x808);
  boost::container::
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ::vector(this_00,6);
  std::
  __shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>,void>
            ((__shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>,(__gnu_cxx::_Lock_policy)2>
              *)this,(static_vector<unsigned_char,_2048UL,_void> *)this_00);
  puVar1 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[]((vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                         *)(this->super_enable_shared_from_this<rudp::session>)._M_weak_this.
                           super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  *puVar1 = '\x10';
  puVar1 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[]((vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                         *)(this->super_enable_shared_from_this<rudp::session>)._M_weak_this.
                           super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
  *puVar1 = '\x06';
  bVar2.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  bVar2.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (buffer_ptr_t)
         bVar2.
         super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

buffer_ptr_t session::generate_rst() {
    buffer_ptr_t buffer( new buffer_t( 6 ) );
    (*buffer)[ 0 ] = 0x10;
    (*buffer)[ 1 ] = 6;
    return buffer;
  }